

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_214010::CAPIBuildSystemFrontendDelegate::
commandCannotBuildOutputDueToMissingInputs
          (CAPIBuildSystemFrontendDelegate *this,Command *command,Node *outputNode,
          ArrayRef<llbuild::buildsystem::BuildKey> inputKeys)

{
  pointer ppCVar1;
  CAPIBuildKey *pCVar2;
  string *psVar3;
  Node *extraout_RDX;
  iterator __begin2;
  string *psVar4;
  pointer ppCVar5;
  iterator __begin2_1;
  pointer ppCVar6;
  iterator __end2;
  long lVar7;
  StringRef path;
  CAPIBuildKey *output;
  Command *local_80;
  CAPIBuildSystemFrontendDelegate *local_78;
  CAPIBuildKeysVector inputs;
  string str;
  
  psVar4 = (string *)inputKeys.Data;
  if ((this->cAPIDelegate).command_cannot_build_output_due_to_missing_inputs !=
      (_func_void_void_ptr_llb_buildsystem_command_t_ptr_llb_build_key_t_ptr_ptr_llb_build_key_t_ptr_ptr_uint64_t
       *)0x0) {
    output = (CAPIBuildKey *)0x0;
    local_80 = command;
    local_78 = this;
    if (outputNode != (Node *)0x0) {
      inputs.keys.
      super__Vector_base<(anonymous_namespace)::CAPIBuildKey_*,_std::allocator<(anonymous_namespace)::CAPIBuildKey_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)(outputNode->name)._M_dataplus._M_p;
      inputs.keys.
      super__Vector_base<(anonymous_namespace)::CAPIBuildKey_*,_std::allocator<(anonymous_namespace)::CAPIBuildKey_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)(outputNode->name)._M_string_length;
      psVar3 = psVar4;
      llvm::StringRef::str_abi_cxx11_(&str,(StringRef *)&inputs);
      pCVar2 = (CAPIBuildKey *)operator_new(0x38);
      path.Length = (size_t)psVar3;
      path.Data = (char *)str._M_string_length;
      llbuild::buildsystem::BuildKey::makeNode
                ((BuildKey *)&inputs,(BuildKey *)str._M_dataplus._M_p,path);
      CAPIBuildKey::CAPIBuildKey(pCVar2,(BuildKey *)&inputs);
      output = pCVar2;
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      outputNode = extraout_RDX;
    }
    std::
    vector<(anonymous_namespace)::CAPIBuildKey_*,_std::allocator<(anonymous_namespace)::CAPIBuildKey_*>_>
    ::vector(&inputs.keys,inputKeys.Length,(allocator_type *)outputNode);
    ppCVar6 = inputs.keys.
              super__Vector_base<(anonymous_namespace)::CAPIBuildKey_*,_std::allocator<(anonymous_namespace)::CAPIBuildKey_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppCVar5 = inputs.keys.
              super__Vector_base<(anonymous_namespace)::CAPIBuildKey_*,_std::allocator<(anonymous_namespace)::CAPIBuildKey_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    for (lVar7 = inputKeys.Length << 5;
        ppCVar1 = inputs.keys.
                  super__Vector_base<(anonymous_namespace)::CAPIBuildKey_*,_std::allocator<(anonymous_namespace)::CAPIBuildKey_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish, lVar7 != 0; lVar7 = lVar7 + -0x20) {
      std::__cxx11::string::string((string *)&str,psVar4);
      pCVar2 = (CAPIBuildKey *)operator_new(0x38);
      CAPIBuildKey::CAPIBuildKey(pCVar2,(BuildKey *)&str);
      *ppCVar5 = pCVar2;
      std::__cxx11::string::_M_dispose();
      psVar4 = psVar4 + 0x20;
      ppCVar5 = ppCVar5 + 1;
    }
    (*(local_78->cAPIDelegate).command_cannot_build_output_due_to_missing_inputs)
              ((local_78->cAPIDelegate).context,(llb_buildsystem_command_t *)local_80,
               (llb_build_key_t **)&output,(llb_build_key_t **)ppCVar6,
               (long)inputs.keys.
                     super__Vector_base<(anonymous_namespace)::CAPIBuildKey_*,_std::allocator<(anonymous_namespace)::CAPIBuildKey_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar6 >> 3);
    llb_build_key_destroy((llb_build_key_t *)output);
    for (; ppCVar6 != ppCVar1; ppCVar6 = ppCVar6 + 1) {
      llb_build_key_destroy((llb_build_key_t *)*ppCVar6);
    }
    std::
    vector<(anonymous_namespace)::CAPIBuildKey_*,_std::allocator<(anonymous_namespace)::CAPIBuildKey_*>_>
    ::~vector(&inputs.keys);
  }
  return;
}

Assistant:

virtual void commandCannotBuildOutputDueToMissingInputs(Command* command,
               Node* outputNode, ArrayRef<BuildKey> inputKeys) override {
    if (cAPIDelegate.command_cannot_build_output_due_to_missing_inputs) {
      CAPIBuildKey *output = nullptr;
      if (outputNode) {
        auto str = outputNode->getName().str();
        output = new CAPIBuildKey(BuildKey::makeNode(str));
      }

      CAPIBuildKeysVector inputs(inputKeys);

      cAPIDelegate.command_cannot_build_output_due_to_missing_inputs(
        cAPIDelegate.context,
        (llb_buildsystem_command_t*) command,
        (llb_build_key_t **)&output,
        inputs.data(),
        inputs.count()
      );

      llb_build_key_destroy((llb_build_key_t *)output);
    }
  }